

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

int call_extract_if_dead(connectdata *conn,void *param)

{
  _Bool _Var1;
  
  _Var1 = extract_if_dead(conn,*param);
  if (_Var1) {
    *(connectdata **)((long)param + 8) = conn;
  }
  return (uint)_Var1;
}

Assistant:

static int call_extract_if_dead(struct connectdata *conn, void *param)
{
  struct prunedead *p = (struct prunedead *)param;
  if(extract_if_dead(conn, p->data)) {
    /* stop the iteration here, pass back the connection that was extracted */
    p->extracted = conn;
    return 1;
  }
  return 0; /* continue iteration */
}